

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_orphaned_memorydata(NetOptimize *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference ppLVar4;
  reference pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  long in_RDI;
  size_t k;
  bool orphaned;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_ffffffffffffffa8;
  FILE *in_stack_ffffffffffffffb0;
  ulong local_38;
  size_type local_28;
  size_type local_18;
  
  sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (sVar3 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar2) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->tops,0);
      iVar1 = *pvVar5;
      local_28 = local_18;
      do {
        do {
          local_28 = local_28 + 1;
          if (sVar3 <= local_28) goto LAB_0015c20d;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        } while (bVar2);
        bVar2 = true;
        local_38 = 0;
        while( true ) {
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar4)->bottoms);
          if (sVar6 <= local_38) break;
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->bottoms,local_38)
          ;
          if (*pvVar5 == iVar1) {
            bVar2 = false;
            break;
          }
          local_38 = local_38 + 1;
        }
      } while (bVar2);
LAB_0015c20d:
      if (sVar3 <= local_28) {
        in_stack_ffffffffffffffb0 = _stderr;
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_18);
        uVar7 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffffb0,"eliminate_orphaned_memorydata %s\n",uVar7);
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        std::__cxx11::string::operator=((string *)&(*ppLVar4)->type,"ncnnfused");
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_orphaned_memorydata()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - X
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool orphaned = true;
            for (size_t k = 0; k < layers[j]->bottoms.size(); k++)
            {
                if (layers[j]->bottoms[k] == top_blob_index)
                {
                    orphaned = false;
                    break;
                }
            }

            if (!orphaned)
                break;
        }

        if (j < layer_count)
            continue;

        // assert orphaned == true
        fprintf(stderr, "eliminate_orphaned_memorydata %s\n", layers[i]->name.c_str());

        layers[i]->type = "ncnnfused";
    }

    return 0;
}